

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

void __thiscall cmCTestScriptHandler::CreateCMake(cmCTestScriptHandler *this)

{
  cmStateSnapshot *__return_storage_ptr__;
  int recursionDepth;
  pointer pcVar1;
  pointer this_00;
  unique_ptr<cmake,_std::default_delete<cmake>_> *this_01;
  unique_ptr<cmCTestUploadCommand,_std::default_delete<cmCTestUploadCommand>_> local_440;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> local_438;
  allocator<char> local_429;
  string local_428;
  unique_ptr<cmCTestUpdateCommand,_std::default_delete<cmCTestUpdateCommand>_> local_408;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> local_400;
  allocator<char> local_3f1;
  string local_3f0;
  unique_ptr<cmCTestTestCommand,_std::default_delete<cmCTestTestCommand>_> local_3d0;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> local_3c8;
  allocator<char> local_3b9;
  string local_3b8;
  unique_ptr<cmCTestSubmitCommand,_std::default_delete<cmCTestSubmitCommand>_> local_398;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> local_390;
  allocator<char> local_381;
  string local_380;
  unique_ptr<cmCTestStartCommand,_std::default_delete<cmCTestStartCommand>_> local_360;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> local_358;
  allocator<char> local_349;
  string local_348;
  unique_ptr<cmCTestSleepCommand,_std::default_delete<cmCTestSleepCommand>_> local_328;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> local_320;
  allocator<char> local_311;
  string local_310;
  unique_ptr<cmCTestRunScriptCommand,_std::default_delete<cmCTestRunScriptCommand>_> local_2f0;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> local_2e8;
  allocator<char> local_2d9;
  string local_2d8;
  unique_ptr<cmCTestReadCustomFilesCommand,_std::default_delete<cmCTestReadCustomFilesCommand>_>
  local_2b8;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> local_2b0;
  allocator<char> local_2a1;
  string local_2a0;
  unique_ptr<cmCTestMemCheckCommand,_std::default_delete<cmCTestMemCheckCommand>_> local_280;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> local_278;
  allocator<char> local_269;
  string local_268;
  unique_ptr<cmCTestEmptyBinaryDirectoryCommand,_std::default_delete<cmCTestEmptyBinaryDirectoryCommand>_>
  local_248;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> local_240;
  allocator<char> local_231;
  string local_230;
  unique_ptr<cmCTestCoverageCommand,_std::default_delete<cmCTestCoverageCommand>_> local_210;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> local_208;
  allocator<char> local_1f9;
  string local_1f8;
  unique_ptr<cmCTestConfigureCommand,_std::default_delete<cmCTestConfigureCommand>_> local_1d8;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> local_1d0;
  allocator<char> local_1c1;
  string local_1c0;
  unique_ptr<cmCTestBuildCommand,_std::default_delete<cmCTestBuildCommand>_> local_1a0;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> local_198;
  allocator<char> local_189;
  string local_188;
  anon_class_8_1_8991fb9c local_168;
  ProgressCallbackType local_160;
  undefined1 local_140 [56];
  cmStateDirectory local_108;
  undefined1 local_e0 [8];
  string cwd;
  cmStateSnapshot snapshot;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_a0;
  cmStateSnapshot local_98;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  undefined4 local_20;
  Mode local_1c;
  unique_ptr<cmake,_std::default_delete<cmake>_> local_18;
  cmCTestScriptHandler *local_10;
  cmCTestScriptHandler *this_local;
  
  local_1c = Project;
  local_20 = 4;
  local_10 = this;
  std::make_unique<cmake,cmake::Role,cmState::Mode>((Role *)&local_18,&local_1c);
  std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator=(&this->CMake,&local_18);
  std::unique_ptr<cmake,_std::default_delete<cmake>_>::~unique_ptr(&local_18);
  pcVar1 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMake);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  cmake::SetHomeDirectory(pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pcVar1 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMake);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
  cmake::SetHomeOutputDirectory(pcVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  this_01 = &this->CMake;
  pcVar1 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(this_01);
  cmake::GetCurrentSnapshot(&local_98,pcVar1);
  cmStateSnapshot::SetDefaultDefinitions(&local_98);
  pcVar1 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(this_01);
  cmake::AddCMakePaths(pcVar1);
  std::unique_ptr<cmake,_std::default_delete<cmake>_>::get(this_01);
  std::make_unique<cmGlobalGenerator,cmake*>((cmake **)&local_a0);
  std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::operator=
            (&this->GlobalGenerator,&local_a0);
  std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
            (&local_a0);
  pcVar1 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(this_01);
  __return_storage_ptr__ = (cmStateSnapshot *)((long)&cwd.field_2 + 8);
  cmake::GetCurrentSnapshot(__return_storage_ptr__,pcVar1);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmStateSnapshot::GetDirectory(&local_108,__return_storage_ptr__);
  cmStateDirectory::SetCurrentSource(&local_108,(string *)local_e0);
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)(local_140 + 0x10),(cmStateSnapshot *)((long)&cwd.field_2 + 8));
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)(local_140 + 0x10),(string *)local_e0);
  local_140._0_8_ =
       std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::get
                 (&this->GlobalGenerator);
  std::make_unique<cmMakefile,cmGlobalGenerator*,cmStateSnapshot&>
            ((cmGlobalGenerator **)(local_140 + 8),(cmStateSnapshot *)local_140);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator=
            (&this->Makefile,
             (unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)(local_140 + 8));
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)(local_140 + 8));
  if (this->ParentMakefile != (cmMakefile *)0x0) {
    this_00 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                        (&this->Makefile);
    recursionDepth = cmMakefile::GetRecursionDepth(this->ParentMakefile);
    cmMakefile::SetRecursionDepth(this_00,recursionDepth);
  }
  pcVar1 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMake);
  local_168.this = this;
  std::function<void(std::__cxx11::string_const&,float)>::
  function<cmCTestScriptHandler::CreateCMake()::__0,void>
            ((function<void(std::__cxx11::string_const&,float)> *)&local_160,&local_168);
  cmake::SetProgressCallback(pcVar1,&local_160);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::~function(&local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"ctest_build",&local_189);
  std::make_unique<cmCTestBuildCommand>();
  std::unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>>::
  unique_ptr<cmCTestBuildCommand,std::default_delete<cmCTestBuildCommand>,void>
            ((unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>> *)&local_198,&local_1a0
            );
  AddCTestCommand(this,&local_188,&local_198);
  std::unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_>::~unique_ptr(&local_198);
  std::unique_ptr<cmCTestBuildCommand,_std::default_delete<cmCTestBuildCommand>_>::~unique_ptr
            (&local_1a0);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"ctest_configure",&local_1c1);
  std::make_unique<cmCTestConfigureCommand>();
  std::unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>>::
  unique_ptr<cmCTestConfigureCommand,std::default_delete<cmCTestConfigureCommand>,void>
            ((unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>> *)&local_1d0,&local_1d8
            );
  AddCTestCommand(this,&local_1c0,&local_1d0);
  std::unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_>::~unique_ptr(&local_1d0);
  std::unique_ptr<cmCTestConfigureCommand,_std::default_delete<cmCTestConfigureCommand>_>::
  ~unique_ptr(&local_1d8);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"ctest_coverage",&local_1f9);
  std::make_unique<cmCTestCoverageCommand>();
  std::unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>>::
  unique_ptr<cmCTestCoverageCommand,std::default_delete<cmCTestCoverageCommand>,void>
            ((unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>> *)&local_208,&local_210
            );
  AddCTestCommand(this,&local_1f8,&local_208);
  std::unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_>::~unique_ptr(&local_208);
  std::unique_ptr<cmCTestCoverageCommand,_std::default_delete<cmCTestCoverageCommand>_>::~unique_ptr
            (&local_210);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"ctest_empty_binary_directory",&local_231);
  std::make_unique<cmCTestEmptyBinaryDirectoryCommand>();
  std::unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>>::
  unique_ptr<cmCTestEmptyBinaryDirectoryCommand,std::default_delete<cmCTestEmptyBinaryDirectoryCommand>,void>
            ((unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>> *)&local_240,&local_248
            );
  AddCTestCommand(this,&local_230,&local_240);
  std::unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_>::~unique_ptr(&local_240);
  std::
  unique_ptr<cmCTestEmptyBinaryDirectoryCommand,_std::default_delete<cmCTestEmptyBinaryDirectoryCommand>_>
  ::~unique_ptr(&local_248);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"ctest_memcheck",&local_269);
  std::make_unique<cmCTestMemCheckCommand>();
  std::unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>>::
  unique_ptr<cmCTestMemCheckCommand,std::default_delete<cmCTestMemCheckCommand>,void>
            ((unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>> *)&local_278,&local_280
            );
  AddCTestCommand(this,&local_268,&local_278);
  std::unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_>::~unique_ptr(&local_278);
  std::unique_ptr<cmCTestMemCheckCommand,_std::default_delete<cmCTestMemCheckCommand>_>::~unique_ptr
            (&local_280);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"ctest_read_custom_files",&local_2a1);
  std::make_unique<cmCTestReadCustomFilesCommand>();
  std::unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>>::
  unique_ptr<cmCTestReadCustomFilesCommand,std::default_delete<cmCTestReadCustomFilesCommand>,void>
            ((unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>> *)&local_2b0,&local_2b8
            );
  AddCTestCommand(this,&local_2a0,&local_2b0);
  std::unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_>::~unique_ptr(&local_2b0);
  std::
  unique_ptr<cmCTestReadCustomFilesCommand,_std::default_delete<cmCTestReadCustomFilesCommand>_>::
  ~unique_ptr(&local_2b8);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"ctest_run_script",&local_2d9);
  std::make_unique<cmCTestRunScriptCommand>();
  std::unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>>::
  unique_ptr<cmCTestRunScriptCommand,std::default_delete<cmCTestRunScriptCommand>,void>
            ((unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>> *)&local_2e8,&local_2f0
            );
  AddCTestCommand(this,&local_2d8,&local_2e8);
  std::unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_>::~unique_ptr(&local_2e8);
  std::unique_ptr<cmCTestRunScriptCommand,_std::default_delete<cmCTestRunScriptCommand>_>::
  ~unique_ptr(&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"ctest_sleep",&local_311);
  std::make_unique<cmCTestSleepCommand>();
  std::unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>>::
  unique_ptr<cmCTestSleepCommand,std::default_delete<cmCTestSleepCommand>,void>
            ((unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>> *)&local_320,&local_328
            );
  AddCTestCommand(this,&local_310,&local_320);
  std::unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_>::~unique_ptr(&local_320);
  std::unique_ptr<cmCTestSleepCommand,_std::default_delete<cmCTestSleepCommand>_>::~unique_ptr
            (&local_328);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"ctest_start",&local_349);
  std::make_unique<cmCTestStartCommand>();
  std::unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>>::
  unique_ptr<cmCTestStartCommand,std::default_delete<cmCTestStartCommand>,void>
            ((unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>> *)&local_358,&local_360
            );
  AddCTestCommand(this,&local_348,&local_358);
  std::unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_>::~unique_ptr(&local_358);
  std::unique_ptr<cmCTestStartCommand,_std::default_delete<cmCTestStartCommand>_>::~unique_ptr
            (&local_360);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"ctest_submit",&local_381)
  ;
  std::make_unique<cmCTestSubmitCommand>();
  std::unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>>::
  unique_ptr<cmCTestSubmitCommand,std::default_delete<cmCTestSubmitCommand>,void>
            ((unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>> *)&local_390,&local_398
            );
  AddCTestCommand(this,&local_380,&local_390);
  std::unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_>::~unique_ptr(&local_390);
  std::unique_ptr<cmCTestSubmitCommand,_std::default_delete<cmCTestSubmitCommand>_>::~unique_ptr
            (&local_398);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"ctest_test",&local_3b9);
  std::make_unique<cmCTestTestCommand>();
  std::unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>>::
  unique_ptr<cmCTestTestCommand,std::default_delete<cmCTestTestCommand>,void>
            ((unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>> *)&local_3c8,&local_3d0
            );
  AddCTestCommand(this,&local_3b8,&local_3c8);
  std::unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_>::~unique_ptr(&local_3c8);
  std::unique_ptr<cmCTestTestCommand,_std::default_delete<cmCTestTestCommand>_>::~unique_ptr
            (&local_3d0);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"ctest_update",&local_3f1)
  ;
  std::make_unique<cmCTestUpdateCommand>();
  std::unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>>::
  unique_ptr<cmCTestUpdateCommand,std::default_delete<cmCTestUpdateCommand>,void>
            ((unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>> *)&local_400,&local_408
            );
  AddCTestCommand(this,&local_3f0,&local_400);
  std::unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_>::~unique_ptr(&local_400);
  std::unique_ptr<cmCTestUpdateCommand,_std::default_delete<cmCTestUpdateCommand>_>::~unique_ptr
            (&local_408);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"ctest_upload",&local_429)
  ;
  std::make_unique<cmCTestUploadCommand>();
  std::unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>>::
  unique_ptr<cmCTestUploadCommand,std::default_delete<cmCTestUploadCommand>,void>
            ((unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>> *)&local_438,&local_440
            );
  AddCTestCommand(this,&local_428,&local_438);
  std::unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_>::~unique_ptr(&local_438);
  std::unique_ptr<cmCTestUploadCommand,_std::default_delete<cmCTestUploadCommand>_>::~unique_ptr
            (&local_440);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::string::~string((string *)local_e0);
  return;
}

Assistant:

void cmCTestScriptHandler::CreateCMake()
{
  // create a cmake instance to read the configuration script
  this->CMake = cm::make_unique<cmake>(cmake::RoleScript, cmState::CTest);
  this->CMake->SetHomeDirectory("");
  this->CMake->SetHomeOutputDirectory("");
  this->CMake->GetCurrentSnapshot().SetDefaultDefinitions();
  this->CMake->AddCMakePaths();
  this->GlobalGenerator =
    cm::make_unique<cmGlobalGenerator>(this->CMake.get());

  cmStateSnapshot snapshot = this->CMake->GetCurrentSnapshot();
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  snapshot.GetDirectory().SetCurrentSource(cwd);
  snapshot.GetDirectory().SetCurrentBinary(cwd);
  this->Makefile =
    cm::make_unique<cmMakefile>(this->GlobalGenerator.get(), snapshot);
  if (this->ParentMakefile) {
    this->Makefile->SetRecursionDepth(
      this->ParentMakefile->GetRecursionDepth());
  }

  this->CMake->SetProgressCallback(
    [this](const std::string& m, float /*unused*/) {
      if (!m.empty()) {
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "-- " << m << std::endl);
      }
    });

  this->AddCTestCommand("ctest_build", cm::make_unique<cmCTestBuildCommand>());
  this->AddCTestCommand("ctest_configure",
                        cm::make_unique<cmCTestConfigureCommand>());
  this->AddCTestCommand("ctest_coverage",
                        cm::make_unique<cmCTestCoverageCommand>());
  this->AddCTestCommand("ctest_empty_binary_directory",
                        cm::make_unique<cmCTestEmptyBinaryDirectoryCommand>());
  this->AddCTestCommand("ctest_memcheck",
                        cm::make_unique<cmCTestMemCheckCommand>());
  this->AddCTestCommand("ctest_read_custom_files",
                        cm::make_unique<cmCTestReadCustomFilesCommand>());
  this->AddCTestCommand("ctest_run_script",
                        cm::make_unique<cmCTestRunScriptCommand>());
  this->AddCTestCommand("ctest_sleep", cm::make_unique<cmCTestSleepCommand>());
  this->AddCTestCommand("ctest_start", cm::make_unique<cmCTestStartCommand>());
  this->AddCTestCommand("ctest_submit",
                        cm::make_unique<cmCTestSubmitCommand>());
  this->AddCTestCommand("ctest_test", cm::make_unique<cmCTestTestCommand>());
  this->AddCTestCommand("ctest_update",
                        cm::make_unique<cmCTestUpdateCommand>());
  this->AddCTestCommand("ctest_upload",
                        cm::make_unique<cmCTestUploadCommand>());
}